

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# computation.c
# Opt level: O1

void apx_computation_create
               (apx_computation_t *self,apx_computation_vtable_t *vtable,
               apx_computationType_t computation_type)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  
  if (self != (apx_computation_t *)0x0) {
    if (vtable == (apx_computation_vtable_t *)0x0) {
      uVar1 = 0;
      uVar2 = 0;
      uVar3 = 0;
      uVar4 = 0;
    }
    else {
      uVar1 = *(undefined4 *)&vtable->destructor;
      uVar2 = *(undefined4 *)((long)&vtable->destructor + 4);
      uVar3 = *(undefined4 *)&vtable->to_string;
      uVar4 = *(undefined4 *)((long)&vtable->to_string + 4);
    }
    *(undefined4 *)&(self->vtable).destructor = uVar1;
    *(undefined4 *)((long)&(self->vtable).destructor + 4) = uVar2;
    *(undefined4 *)&(self->vtable).to_string = uVar3;
    *(undefined4 *)((long)&(self->vtable).to_string + 4) = uVar4;
    self->computation_type = computation_type;
    self->is_signed_range = false;
    self->lower_limit = (anon_union_4_2_43a9a9ed_for_lower_limit)0x0;
    self->upper_limit = (anon_union_4_2_43a9a9ed_for_upper_limit)0x0;
  }
  return;
}

Assistant:

void apx_computation_create(apx_computation_t* self, apx_computation_vtable_t const* vtable, apx_computationType_t computation_type)
{
   if (self != NULL)
   {
      if (vtable != NULL)
      {
         memcpy(&self->vtable, vtable, sizeof(apx_computation_vtable_t));
      }
      else
      {
         memset(&self->vtable, 0u, sizeof(apx_computation_vtable_t));
      }
      self->computation_type = computation_type;
      self->is_signed_range = false;
      self->lower_limit.i32 = 0;
      self->upper_limit.i32 = 0;
   }
}